

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  uint *__dest;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint16_t outValue;
  ushort local_48;
  allocator_type local_45;
  uint local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ulong local_38;
  
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  uVar9 = targetBits >> 3;
  local_40 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar9 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_45);
  pvVar2 = local_40;
  if ((this->super_Image).height != 0) {
    local_38 = (ulong)uVar9;
    uVar6 = 0;
    local_44 = uVar9;
    do {
      if ((this->super_Image).width != 0) {
        uVar10 = 0;
        do {
          if (numChannels != 0) {
            uVar8 = 0;
            do {
              uVar5 = (this->super_Image).width * uVar6 + uVar10;
              uVar7 = (uint)uVar8;
              uVar4 = 3;
              if (uVar7 < 3) {
                uVar4 = uVar8;
              }
              uVar1 = *(uint *)((long)&this->pixels[uVar5].field_0 + uVar4 * 4);
              __dest = (uint *)((pvVar2->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start +
                               (uVar5 * numChannels + uVar7) * uVar9);
              if (targetBits == 0x10) {
                uVar9 = uVar1 >> 0x17;
                cVar3 = (char)uVar9;
                if (cVar3 == '\0') {
                  local_48 = 0;
                }
                else {
                  uVar5 = uVar9 & 0xff;
                  if (uVar5 == 0xff) {
                    local_48 = ((uVar1 & 0x7fffff) != 0 | 0x3e) << 9;
                  }
                  else {
                    local_48 = 0x7c00;
                    if (uVar5 < 0x8f) {
                      if (uVar5 < 0x71) {
                        if (uVar5 < 0x66) {
                          local_48 = 0;
                          goto LAB_0017c1f1;
                        }
                        uVar9 = uVar1 & 0x7fffff | 0x800000;
                        local_48 = (ushort)(uVar9 >> (0x7eU - cVar3 & 0x1f)) & 0x3ff;
                        uVar9 = uVar9 >> ((byte)(0x7d - cVar3) & 0x1f);
                      }
                      else {
                        local_48 = ((ushort)(uVar1 >> 0xd) & 0x3ff | (ushort)((uVar9 & 0x1f) << 10))
                                   ^ 0x4000;
                        uVar9 = uVar1 >> 0xc;
                      }
                      local_48 = local_48 + ((uVar9 & 1) != 0);
                    }
LAB_0017c1f1:
                    local_48 = local_48 & 0x7fff;
                  }
                }
                local_48 = local_48 | (ushort)(uVar1 >> 0x10) & 0x8000;
                memcpy(__dest,&local_48,local_38);
                pvVar2 = local_40;
                uVar9 = local_44;
              }
              else if (targetBits == 0x20) {
                *__dest = uVar1;
              }
              uVar8 = (ulong)(uVar7 + 1);
            } while (numChannels != uVar7 + 1);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (this->super_Image).width);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->super_Image).height);
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }